

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScenePrivate::grabKeyboard(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  QGraphicsItem **ppQVar4;
  long lVar5;
  qsizetype i;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 local_34;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->keyboardGrabberItems).d.size;
  if (lVar3 == 0) {
    i = 0;
  }
  else {
    ppQVar4 = (this->keyboardGrabberItems).d.ptr;
    lVar5 = 0;
    do {
      if (lVar3 * 8 - lVar5 == 0) goto LAB_00601419;
      lVar1 = lVar5 + 8;
      plVar2 = (long *)((long)ppQVar4 + lVar5);
      lVar5 = lVar1;
    } while ((QGraphicsItem *)*plVar2 != item);
    if (lVar1 != 0) {
      if (ppQVar4[lVar3 + -1] == item) {
        grabKeyboard();
      }
      else {
        local_48._0_4_ = 2;
        local_48._4_4_ = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        uStack_38 = 0;
        local_34 = 0;
        local_30 = "default";
        QMessageLogger::warning
                  ((char *)&local_48,
                   "QGraphicsItem::grabKeyboard: already blocked by keyboard grabber: %p");
      }
      goto LAB_006014b8;
    }
LAB_00601419:
    local_48._0_4_ = 0xaaaaaaaa;
    local_48._4_4_ = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,UngrabKeyboard);
    sendEvent(this,(this->keyboardGrabberItems).d.ptr[(this->keyboardGrabberItems).d.size + -1],
              (QEvent *)&local_48);
    QEvent::~QEvent((QEvent *)&local_48);
    i = (this->keyboardGrabberItems).d.size;
  }
  local_48 = item;
  QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
            ((QPodArrayOps<QGraphicsItem*> *)&this->keyboardGrabberItems,i,
             (QGraphicsItem **)&local_48);
  QList<QGraphicsItem_*>::end(&this->keyboardGrabberItems);
  local_48._0_4_ = 0xaaaaaaaa;
  local_48._4_4_ = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,GrabKeyboard);
  sendEvent(this,item,(QEvent *)&local_48);
  QEvent::~QEvent((QEvent *)&local_48);
LAB_006014b8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::grabKeyboard(QGraphicsItem *item)
{
    if (keyboardGrabberItems.contains(item)) {
        if (keyboardGrabberItems.constLast() == item)
            qWarning("QGraphicsItem::grabKeyboard: already a keyboard grabber");
        else
            qWarning("QGraphicsItem::grabKeyboard: already blocked by keyboard grabber: %p",
                     keyboardGrabberItems.constLast());
        return;
    }

    // Send ungrab event to the last grabber.
    if (!keyboardGrabberItems.isEmpty()) {
        // Just send ungrab event to current grabber.
        QEvent ungrabEvent(QEvent::UngrabKeyboard);
        sendEvent(keyboardGrabberItems.constLast(), &ungrabEvent);
    }

    keyboardGrabberItems << item;

    // Send grab event to current grabber.
    QEvent grabEvent(QEvent::GrabKeyboard);
    sendEvent(item, &grabEvent);
}